

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O2

ssize_t __thiscall kj::FdOutputStream::write(FdOutputStream *this,int __fd,void *__buf,size_t __n)

{
  size_t *psVar1;
  uint uVar2;
  int code;
  iovec *piVar3;
  void *pvVar4;
  ulong uVar5;
  ssize_t extraout_RAX;
  iovec *piVar6;
  undefined4 in_register_00000034;
  long lVar7;
  long lVar8;
  iovec *__iovec;
  Fault f;
  Array<iovec> iov_heap;
  iovec iov_stack [16];
  Fault local_160;
  Array<iovec> local_158;
  iovec local_138 [16];
  
  lVar7 = CONCAT44(in_register_00000034,__fd);
  lVar8 = (long)__buf * -0x10;
  for (; (void *)0x400 < __buf; __buf = (void *)((long)__buf + -0x400)) {
    (*(this->super_OutputStream)._vptr_OutputStream[3])(this,lVar7,0x400);
    lVar7 = lVar7 + 0x4000;
    lVar8 = lVar8 + 0x4000;
  }
  if (__buf < (void *)0x11) {
    local_158.ptr = (iovec *)0x0;
    local_158.size_ = 0;
    local_158.disposer = (ArrayDisposer *)0x0;
    piVar3 = local_138;
  }
  else {
    piVar3 = _::HeapArrayDisposer::allocate<iovec>((size_t)__buf);
    local_158.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
    local_158.ptr = piVar3;
    local_158.size_ = (size_t)__buf;
  }
  for (uVar2 = 0; pvVar4 = (void *)(ulong)uVar2, pvVar4 < __buf; uVar2 = uVar2 + 1) {
    piVar3[(long)pvVar4].iov_base = *(void **)(lVar7 + (long)pvVar4 * 0x10);
    piVar3[(long)pvVar4].iov_len = *(size_t *)(lVar7 + 8 + (long)pvVar4 * 0x10);
  }
  piVar6 = (iovec *)((long)piVar3 - lVar8);
  for (__iovec = piVar3; (__iovec < piVar6 && (__iovec->iov_len == 0)); __iovec = __iovec + 1) {
  }
  do {
    if (piVar6 <= __iovec) {
      Array<iovec>::~Array(&local_158);
      return extraout_RAX;
    }
    while( true ) {
      uVar5 = writev(this->fd,(iovec *)__iovec,
                     (int)((ulong)((long)piVar3 + (-(long)__iovec - lVar8)) >> 4));
      if (-1 < (long)uVar5) break;
      code = _::Debug::getOsErrorNumber(false);
      if (code != -1) {
        if (code != 0) {
          _::Debug::Fault::Fault<int,int&>
                    (&local_160,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/io.c++"
                     ,0x196,code,"n = ::writev(fd, current, iov.end() - current)","fd",&this->fd);
          _::Debug::Fault::fatal(&local_160);
        }
        goto LAB_001c6050;
      }
    }
    if (uVar5 == 0) {
LAB_001c6050:
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
                (&local_160,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/io.c++"
                 ,0x197,FAILED,"n > 0","\"writev() returned zero.\"",
                 (char (*) [24])"writev() returned zero.");
      _::Debug::Fault::fatal(&local_160);
    }
    for (; (__iovec < piVar6 && (psVar1 = &__iovec->iov_len, *psVar1 <= uVar5));
        __iovec = __iovec + 1) {
      uVar5 = uVar5 - *psVar1;
    }
    if (0 < (long)uVar5) {
      __iovec->iov_base = (void *)((long)__iovec->iov_base + uVar5);
      __iovec->iov_len = __iovec->iov_len - uVar5;
    }
  } while( true );
}

Assistant:

void FdOutputStream::write(ArrayPtr<const ArrayPtr<const byte>> pieces) {
#if _WIN32
  // Windows has no reasonable writev(). It has WriteFileGather, but this call has the unreasonable
  // restriction that each segment must be page-aligned. So, fall back to the default implementation

  OutputStream::write(pieces);

#else
  const size_t iovmax = miniposix::iovMax(pieces.size());
  while (pieces.size() > iovmax) {
    write(pieces.slice(0, iovmax));
    pieces = pieces.slice(iovmax, pieces.size());
  }

  KJ_STACK_ARRAY(struct iovec, iov, pieces.size(), 16, 128);

  for (uint i = 0; i < pieces.size(); i++) {
    // writev() interface is not const-correct.  :(
    iov[i].iov_base = const_cast<byte*>(pieces[i].begin());
    iov[i].iov_len = pieces[i].size();
  }

  struct iovec* current = iov.begin();

  // Advance past any leading empty buffers so that a write full of only empty buffers does not
  // cause a syscall at all.
  while (current < iov.end() && current->iov_len == 0) {
    ++current;
  }

  while (current < iov.end()) {
    // Issue the write.
    ssize_t n = 0;
    KJ_SYSCALL(n = ::writev(fd, current, iov.end() - current), fd);
    KJ_ASSERT(n > 0, "writev() returned zero.");

    // Advance past all buffers that were fully-written.
    while (current < iov.end() && static_cast<size_t>(n) >= current->iov_len) {
      n -= current->iov_len;
      ++current;
    }

    // If we only partially-wrote one of the buffers, adjust the pointer and size to include only
    // the unwritten part.
    if (n > 0) {
      current->iov_base = reinterpret_cast<byte*>(current->iov_base) + n;
      current->iov_len -= n;
    }
  }
#endif
}